

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t *receiverType;
  ulong *function;
  _Bool _Var2;
  uint uVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  sysbvm_tuple_t sVar8;
  anon_struct_160_20_88b2b351 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_118;
  sysbvm_tuple_t local_110;
  sysbvm_tuple_t local_108;
  sysbvm_tuple_t local_100;
  sysbvm_tuple_t local_f8;
  sysbvm_tuple_t *local_f0;
  sysbvm_tuple_t local_e8;
  sysbvm_tuple_t *local_e0;
  sysbvm_tuple_t local_d8;
  ulong *local_d0;
  sysbvm_tuple_t *local_c8;
  sysbvm_tuple_t local_c0;
  sysbvm_tuple_t local_b8;
  sysbvm_tuple_t local_b0;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t local_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t local_90;
  sysbvm_tuple_t *local_88;
  sysbvm_tuple_t local_80;
  sysbvm_stackFrameRecord_t local_78;
  undefined8 local_68;
  undefined1 *puStack_60;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_tuple_t *local_38;
  sysbvm_tuple_t local_30;
  sysbvm_tuple_t local_28;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&local_118,0,0xa0);
  local_78.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_78.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_78._12_4_ = 0;
  local_68 = 0x14;
  puStack_60 = (undefined1 *)&local_118;
  sysbvm_stackFrame_pushRecord(&local_78);
  local_118 = sysbvm_context_shallowCopy(context,*arguments);
  sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_118 + 0x18) = sVar4;
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(local_118 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  if (*(sysbvm_tuple_t *)(local_118 + 0x28) == 0) {
    local_100 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                          (context,*(sysbvm_tuple_t *)(local_118 + 0x38),(context->roots).symbolType
                           ,arguments[1]);
    *(sysbvm_tuple_t *)(local_118 + 0x38) = local_100;
  }
  else {
    local_110 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                          (context,*(sysbvm_tuple_t *)(local_118 + 0x28),
                           (context->roots).directTypeInferenceType,arguments[1]);
    *(sysbvm_tuple_t *)(local_118 + 0x28) = local_110;
    if ((local_110 & 0xf) == 0 && local_110 != 0) {
      local_f0 = *(sysbvm_tuple_t **)(local_110 + 0x20);
    }
    else {
      local_f0 = (sysbvm_tuple_t *)0x0;
    }
    _Var2 = sysbvm_astNode_isTupleWithLookupStartingFromNode(context,local_110);
    if (_Var2) {
      sVar4 = *(sysbvm_tuple_t *)(local_110 + 0x28);
      *(sysbvm_tuple_t *)(local_118 + 0x28) = sVar4;
      local_108 = *(sysbvm_tuple_t *)(local_110 + 0x30);
      local_110 = sVar4;
LAB_0011be92:
      *(sysbvm_tuple_t *)(local_118 + 0x30) = local_108;
    }
    else if (*(sysbvm_tuple_t *)(local_118 + 0x30) != 0) {
      local_108 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                            (context,*(sysbvm_tuple_t *)(local_118 + 0x30),(context->roots).typeType
                             ,arguments[1]);
      goto LAB_0011be92;
    }
    if (local_f0 == (sysbvm_tuple_t *)0x0) {
      local_100 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                            (context,*(sysbvm_tuple_t *)(local_118 + 0x38),
                             (context->roots).symbolType,arguments[1]);
      *(sysbvm_tuple_t *)(local_118 + 0x38) = local_100;
      _Var2 = sysbvm_astNode_isLiteralNode(context,local_100);
      if (_Var2) {
        local_d8 = sysbvm_astLiteralNode_getValue(*(sysbvm_tuple_t *)(local_118 + 0x38));
        local_d0 = (ulong *)sysbvm_type_lookupMacroSelector
                                      (context,(context->roots).anyValueType,local_d8);
      }
    }
    else {
      uVar7 = (ulong)((uint)local_f0 & 0xf);
      if (uVar7 == 0xf) {
        local_e8 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_f0 >> 4);
      }
      else if (uVar7 == 0) {
        local_e8 = *local_f0;
      }
      else {
        local_e8 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar7);
      }
      local_c0 = sysbvm_type_getAnalyzeMessageSendNodeWithEnvironmentFunction(context,local_e8);
      if ((local_c0 != 0) &&
         (_Var2 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_118 + 0x28)), _Var2
         )) {
        local_28 = arguments[1];
        local_38 = local_f0;
        local_30 = local_118;
        local_b8 = sysbvm_function_apply(context,local_c0,3,(sysbvm_tuple_t *)&local_38,0);
        sysbvm_stackFrame_popRecord(&local_50);
        sysbvm_stackFrame_popRecord(&local_78);
        return local_b8;
      }
      local_100 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                            (context,*(sysbvm_tuple_t *)(local_118 + 0x38),
                             (context->roots).symbolType,arguments[1]);
      *(sysbvm_tuple_t *)(local_118 + 0x38) = local_100;
      _Var2 = sysbvm_astNode_isLiteralNode(context,local_100);
      if (_Var2) {
        local_d8 = sysbvm_astLiteralNode_getValue(*(sysbvm_tuple_t *)(local_118 + 0x38));
        local_e0 = local_f0;
        local_d0 = (ulong *)sysbvm_type_lookupMacroSelector
                                      (context,(sysbvm_tuple_t)local_f0,local_d8);
        if (local_d0 == (ulong *)0x0) {
          local_d0 = (ulong *)sysbvm_type_lookupSelector(context,(sysbvm_tuple_t)local_f0,local_d8);
        }
        if (local_d0 == (ulong *)0x0) {
          local_d0 = (ulong *)sysbvm_type_lookupFallbackSelector
                                        (context,(sysbvm_tuple_t)local_f0,local_d8);
        }
        if (local_d0 == (ulong *)0x0) {
          if ((((ulong)local_f0 & 0xf) == 0 && local_f0 != (sysbvm_tuple_t *)0x0) &&
             ((local_f0[1] & 0x80) == 0)) {
            uVar7 = local_f0[0xe];
            if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
              uVar3 = (uint)((long)uVar7 >> 4);
            }
            else {
              uVar3 = (uint)*(undefined8 *)(uVar7 + 0x10);
            }
          }
          else {
            uVar3 = 0;
          }
          if ((uVar3 >> 10 & 1) != 0) {
            local_e0 = (sysbvm_tuple_t *)sysbvm_type_decay(context,(sysbvm_tuple_t)local_f0);
            local_d0 = (ulong *)sysbvm_type_lookupMacroSelector
                                          (context,(sysbvm_tuple_t)local_e0,local_d8);
            if (local_d0 == (ulong *)0x0) {
              local_d0 = (ulong *)sysbvm_type_lookupSelector
                                            (context,(sysbvm_tuple_t)local_e0,local_d8);
            }
            if (local_d0 == (ulong *)0x0) {
              local_d0 = (ulong *)sysbvm_type_lookupFallbackSelector
                                            (context,(sysbvm_tuple_t)local_e0,local_d8);
            }
          }
        }
        if (local_d0 == (ulong *)0x0) {
          local_e0 = local_f0;
          local_d0 = (ulong *)sysbvm_type_lookupMacroSelector
                                        (context,(sysbvm_tuple_t)local_f0,
                                         (context->roots).doesNotUnderstandSelector);
          if (local_d0 == (ulong *)0x0) {
            local_d0 = (ulong *)sysbvm_type_lookupSelector
                                          (context,(sysbvm_tuple_t)local_f0,
                                           (context->roots).doesNotUnderstandSelector);
          }
          if (local_d0 == (ulong *)0x0) {
            local_d0 = (ulong *)sysbvm_type_lookupFallbackSelector
                                          (context,(sysbvm_tuple_t)local_f0,
                                           (context->roots).doesNotUnderstandSelector);
          }
          if (((ulong)local_d0 & 0xf) == 0 && local_d0 != (ulong *)0x0) {
            uVar7 = *local_d0;
            if (((uVar7 & 0xf) == 0 && uVar7 != 0) && ((*(byte *)(uVar7 + 8) & 0x80) == 0)) {
              uVar7 = *(ulong *)(uVar7 + 0x70);
              if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
                uVar3 = (uint)((long)uVar7 >> 4);
              }
              else {
                uVar3 = (uint)*(undefined8 *)(uVar7 + 0x10);
              }
            }
            else {
              uVar3 = 0;
            }
            if ((uVar3 >> 0xc & 1) == 0) goto LAB_0011c57a;
            uVar7 = local_d0[5];
            if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
              uVar7 = (long)uVar7 >> 4;
            }
            else {
              uVar7 = *(ulong *)(uVar7 + 0x10);
            }
          }
          else {
LAB_0011c57a:
            uVar7 = 0;
          }
          if ((uVar7 & 1) == 0) {
            local_d0 = (ulong *)0x0;
          }
          if (local_d0 != (ulong *)0x0) {
            if (((ulong)local_d0 & 0xf) == 0) {
              uVar7 = *local_d0;
              if (((uVar7 & 0xf) == 0 && uVar7 != 0) && ((*(byte *)(uVar7 + 8) & 0x80) == 0)) {
                uVar7 = *(ulong *)(uVar7 + 0x70);
                if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
                  uVar3 = (uint)((long)uVar7 >> 4);
                }
                else {
                  uVar3 = (uint)*(undefined8 *)(uVar7 + 0x10);
                }
              }
              else {
                uVar3 = 0;
              }
              if ((uVar3 >> 0xc & 1) == 0) goto LAB_0011c5ff;
              uVar7 = local_d0[5];
              if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
                uVar7 = (long)uVar7 >> 4;
              }
              else {
                uVar7 = *(ulong *)(uVar7 + 0x10);
              }
            }
            else {
LAB_0011c5ff:
              uVar7 = 0;
            }
            if ((uVar7 & 1) != 0) {
              local_88 = (sysbvm_tuple_t *)
                         sysbvm_macroContext_create
                                   (context,*arguments,*(sysbvm_tuple_t *)(local_118 + 0x10),
                                    arguments[1]);
              local_30 = *(undefined8 *)(local_118 + 0x28);
              local_28 = local_118;
              local_38 = local_88;
              local_80 = sysbvm_function_apply
                                   (context,(sysbvm_tuple_t)local_d0,3,(sysbvm_tuple_t *)&local_38,0
                                   );
              sysbvm_stackFrame_popRecord(&local_50);
              sysbvm_stackFrame_popRecord(&local_78);
              sVar4 = local_80;
              goto LAB_0011c28a;
            }
          }
        }
      }
    }
  }
  _Var2 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_118 + 0x30));
  function = local_d0;
  receiverType = local_e0;
  if (local_d0 != (ulong *)0x0) {
    if (!_Var2) {
      _Var2 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_118 + 0x28));
      _Var2 = sysbvm_function_shouldOptimizeLookup
                        (context,(sysbvm_tuple_t)function,(sysbvm_tuple_t)receiverType,_Var2);
      if (!_Var2) goto LAB_0011c18a;
    }
    uVar7 = *(ulong *)(local_118 + 0x40);
    if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
      uVar7 = (ulong)(*(uint *)(uVar7 + 0xc) >> 3);
    }
    else {
      uVar7 = 0;
    }
    local_b0 = sysbvm_astLiteralNode_create
                         (context,*(sysbvm_tuple_t *)(local_118 + 0x10),(sysbvm_tuple_t)local_d0);
    local_a8 = sysbvm_array_create(context,uVar7 + 1);
    if ((local_a8 & 0xf) == 0 && local_a8 != 0) {
      *(undefined8 *)(local_a8 + 0x10) = *(undefined8 *)(local_118 + 0x28);
    }
    if (uVar7 != 0) {
      uVar5 = 0;
      do {
        uVar1 = *(ulong *)(local_118 + 0x40);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          uVar6 = *(undefined8 *)(uVar1 + 0x10 + uVar5 * 8);
        }
        else {
          uVar6 = 0;
        }
        if ((local_a8 & 0xf) == 0 && local_a8 != 0) {
          *(undefined8 *)(local_a8 + 0x18 + uVar5 * 8) = uVar6;
        }
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
    local_a0 = sysbvm_astUnexpandedApplicationNode_create
                         (context,*(sysbvm_tuple_t *)(local_118 + 0x10),local_b0,local_a8);
    sysbvm_stackFrame_popRecord(&local_78);
    sVar4 = local_a0;
LAB_0011c28a:
    sVar4 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                      (context,sVar4,arguments[1]);
    return sVar4;
  }
LAB_0011c18a:
  if (local_d0 == (ulong *)0x0) {
    if ((*(long *)(local_118 + 0x48) != 0x1f) &&
       (sVar4 = sysbvm_type_decay(context,(sysbvm_tuple_t)local_f0), sVar4 != 0)) {
      if ((sVar4 & 0xf) == 0) {
        if ((*(byte *)(sVar4 + 8) & 0x80) != 0) goto LAB_0011c475;
        uVar7 = *(ulong *)(sVar4 + 0x70);
        if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
          uVar7 = (long)uVar7 >> 4;
        }
        else {
          uVar7 = *(ulong *)(uVar7 + 0x10);
        }
      }
      else {
        uVar7 = 0;
      }
      if ((uVar7 & 0x40) == 0) {
        sysbvm_error("Cannot send undeclared message to receiver without a dynamic type.");
      }
    }
  }
  else {
    *(ulong **)(local_118 + 0x50) = local_d0;
    *(sysbvm_tuple_t **)(local_118 + 0x58) = local_e0;
    uVar7 = (ulong)((uint)local_d0 & 0xf);
    if (uVar7 == 0xf) {
      local_c8 = (sysbvm_tuple_t *)
                 sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_d0 >> 4);
    }
    else if (uVar7 == 0) {
      local_c8 = (sysbvm_tuple_t *)*local_d0;
    }
    else {
      local_c8 = (sysbvm_tuple_t *)sysbvm_tuple_getImmediateTypeWithTag(context,uVar7);
    }
    uVar7 = (ulong)local_c8 & 0xf;
    if (uVar7 == 0 && local_c8 != (sysbvm_tuple_t *)0x0) {
      sVar4 = *local_c8;
    }
    else if ((int)uVar7 == 0xf) {
      sVar4 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_c8 >> 4);
    }
    else {
      sVar4 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar7);
    }
    local_c0 = sysbvm_type_getAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context,sVar4);
    if (local_c0 != 0) {
      sysbvm_stackFrame_popRecord(&local_78);
      local_28 = arguments[1];
      local_38 = local_c8;
      local_30 = local_118;
      sVar4 = sysbvm_function_apply(context,local_c0,3,(sysbvm_tuple_t *)&local_38,0);
      return sVar4;
    }
  }
LAB_0011c475:
  sVar4 = 0;
  local_110 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,local_110,0,arguments[1]);
  *(sysbvm_tuple_t *)(local_118 + 0x28) = local_110;
  uVar7 = *(ulong *)(local_118 + 0x40);
  if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
    sVar4 = (sysbvm_tuple_t)(*(uint *)(uVar7 + 0xc) >> 3);
  }
  local_f8 = sysbvm_array_create(context,sVar4);
  if (sVar4 != 0) {
    sVar8 = 0;
    do {
      uVar7 = *(ulong *)(local_118 + 0x40);
      if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
        local_98 = *(sysbvm_tuple_t *)(uVar7 + 0x10 + sVar8 * 8);
      }
      else {
        local_98 = 0;
      }
      local_90 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                           (context,local_98,0,arguments[1]);
      if ((local_f8 & 0xf) == 0 && local_f8 != 0) {
        *(sysbvm_tuple_t *)(local_f8 + 0x10 + sVar8 * 8) = local_90;
      }
      sVar8 = sVar8 + 1;
    } while (sVar4 != sVar8);
  }
  *(sysbvm_tuple_t *)(local_118 + 0x40) = local_f8;
  *(sysbvm_tuple_t *)(local_118 + 0x20) = (context->roots).anyValueType;
  sysbvm_stackFrame_popRecord(&local_50);
  sysbvm_stackFrame_popRecord(&local_78);
  return local_118;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astMessageSendNode_t *sendNode;
        sysbvm_tuple_t analyzedReceiver;
        sysbvm_tuple_t analyzedReceiverTypeExpression;
        sysbvm_tuple_t analyzedSelector;
        sysbvm_tuple_t analyzedArguments;

        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t receiverMetaType;
        sysbvm_tuple_t methodOwner;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t method;
        sysbvm_tuple_t methodType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t result;
        sysbvm_tuple_t newMethodNode;
        sysbvm_tuple_t newArgumentNodes;
        sysbvm_tuple_t unexpandedApplicationNode;

        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgumentNode;

        sysbvm_tuple_t macroContext;
        sysbvm_tuple_t expansionResult;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sendNode = (sysbvm_astMessageSendNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.sendNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.sendNode->super.sourcePosition);

    bool isDoesNotUnderstand = false;
    if(gcFrame.sendNode->receiver)
    {
        gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, gcFrame.sendNode->receiver, *environment);
        gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;
        gcFrame.receiverType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedReceiver);

        // Inline the object with lookup starting from node.
        if(sysbvm_astNode_isTupleWithLookupStartingFromNode(context, gcFrame.analyzedReceiver))
        {
            sysbvm_astTupleWithLookupStartingFromNode_t *objectLookup = (sysbvm_astTupleWithLookupStartingFromNode_t*)gcFrame.analyzedReceiver;
            gcFrame.analyzedReceiver = objectLookup->tupleExpression;
            gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;
            
            gcFrame.analyzedReceiverTypeExpression = objectLookup->typeExpression;
            gcFrame.sendNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
            
        }
        else if(gcFrame.sendNode->receiverLookupType)
        {
            gcFrame.analyzedReceiverTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->receiverLookupType, context->roots.typeType, *environment);
            gcFrame.sendNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
        }

        if(gcFrame.receiverType)
        {
            // If the receiver is a literal node, we can attempt to forward the message send node analysis.
            gcFrame.receiverMetaType = sysbvm_tuple_getType(context, gcFrame.receiverType);
            gcFrame.analysisFunction = sysbvm_type_getAnalyzeMessageSendNodeWithEnvironmentFunction(context, gcFrame.receiverMetaType);

            // HACK: Remove this literal check when properly implementing this.
            if(gcFrame.analysisFunction && sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiver))
            {
                gcFrame.result = sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.receiverType, (sysbvm_tuple_t)gcFrame.sendNode, *environment);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return gcFrame.result;
            }

            // If the selector is a literal, attempt to perform a static lookup.
            gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
            gcFrame.sendNode->selector = gcFrame.analyzedSelector;
            if(sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->selector))
            {
                gcFrame.selector = sysbvm_astLiteralNode_getValue(gcFrame.sendNode->selector);
                gcFrame.methodOwner = gcFrame.receiverType;
                gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, gcFrame.selector);
                if(!gcFrame.method)
                    gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
                if(!gcFrame.method)
                    gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, gcFrame.selector);

                if(!gcFrame.method && sysbvm_type_isReferenceType(gcFrame.receiverType))
                {
                    gcFrame.methodOwner = sysbvm_type_decay(context, gcFrame.receiverType);
                    gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.methodOwner, gcFrame.selector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.methodOwner, gcFrame.selector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.methodOwner, gcFrame.selector);
                }

                // does not understand macro?
                if(!gcFrame.method)
                {
                    gcFrame.methodOwner = gcFrame.receiverType;
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);

                    if(!sysbvm_function_isMacro(context, gcFrame.method))
                        gcFrame.method = SYSBVM_NULL_TUPLE;
                    isDoesNotUnderstand = gcFrame.method != SYSBVM_NULL_TUPLE;
                }
            }
        }
        else
        {
            gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
            gcFrame.sendNode->selector = gcFrame.analyzedSelector;
            if(sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->selector))
            {
                gcFrame.selector = sysbvm_astLiteralNode_getValue(gcFrame.sendNode->selector);
                gcFrame.method = sysbvm_type_lookupMacroSelector(context, context->roots.anyValueType, gcFrame.selector);
            }
        }
    }
    else
    {
        gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
        gcFrame.sendNode->selector = gcFrame.analyzedSelector;
    }

    // Does not understand: 
    if(isDoesNotUnderstand && sysbvm_function_isMacro(context, gcFrame.method))
    {
        // Clear the analyzer token.
        gcFrame.macroContext = sysbvm_macroContext_create(context, *node, gcFrame.sendNode->super.sourcePosition, *environment);
        gcFrame.expansionResult = sysbvm_function_apply3(context, gcFrame.method, gcFrame.macroContext, gcFrame.sendNode->receiver, (sysbvm_tuple_t)gcFrame.sendNode);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

        // Analyze and evaluate the resulting node.
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    // Turn this node onto an unexpanded application.
    bool hasExplicitSolvedLookupType = sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiverLookupType);
    if(gcFrame.method && (hasExplicitSolvedLookupType || sysbvm_function_shouldOptimizeLookup(context, gcFrame.method, gcFrame.methodOwner, sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiver))))
    {
        size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
        gcFrame.newMethodNode = sysbvm_astLiteralNode_create(context, gcFrame.sendNode->super.sourcePosition, gcFrame.method);

        gcFrame.newArgumentNodes = sysbvm_array_create(context, 1 + applicationArgumentCount);
        sysbvm_array_atPut(gcFrame.newArgumentNodes, 0, gcFrame.sendNode->receiver);
        for(size_t i = 0; i < applicationArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.newArgumentNodes, i + 1, sysbvm_array_at(gcFrame.sendNode->arguments, i));

        gcFrame.unexpandedApplicationNode = sysbvm_astUnexpandedApplicationNode_create(context, gcFrame.sendNode->super.sourcePosition, gcFrame.newMethodNode, gcFrame.newArgumentNodes);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.unexpandedApplicationNode, *environment);
    }

    if(gcFrame.method)
    {
        gcFrame.sendNode->boundMethod = gcFrame.method;
        gcFrame.sendNode->boundMethodOwner = gcFrame.methodOwner;
        gcFrame.methodType = sysbvm_tuple_getType(context, gcFrame.method);

        gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context, sysbvm_tuple_getType(context, gcFrame.methodType));
        if(gcFrame.analysisFunction)
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.methodType, (sysbvm_tuple_t)gcFrame.sendNode, *environment);
        }
    }
    else
    {
        if(!sysbvm_tuple_boolean_decode(gcFrame.sendNode->isDynamic) && !sysbvm_type_isDynamic(sysbvm_type_decay(context, gcFrame.receiverType)))
            sysbvm_error("Cannot send undeclared message to receiver without a dynamic type.");
    }

    gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.analyzedReceiver, *environment);
    gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;

    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
    gcFrame.analyzedArguments = sysbvm_array_create(context, applicationArgumentCount);
    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.sendNode->arguments, i);
        gcFrame.analyzedArgumentNode = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgumentNode);
    }

    gcFrame.sendNode->arguments = gcFrame.analyzedArguments;
    gcFrame.sendNode->super.analyzedType = context->roots.anyValueType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.sendNode;
}